

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_decrypt.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  FILE *pFVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  bool bVar7;
  int c;
  size_t i;
  mbedtls_mpi E;
  mbedtls_mpi D;
  mbedtls_mpi Q;
  mbedtls_mpi P;
  mbedtls_mpi N;
  mbedtls_mpi QP;
  mbedtls_mpi DQ;
  mbedtls_mpi DP;
  mbedtls_rsa_context rsa;
  mbedtls_ctr_drbg_context ctr_drbg;
  uchar buf [512];
  uchar result [1024];
  mbedtls_entropy_context entropy;
  
  memset(result,0,0x400);
  if (argc != 1) {
    puts("usage: rsa_decrypt");
    exit(1);
  }
  printf("\n  . Seeding the random number generator...");
  fflush(_stdout);
  mbedtls_rsa_init(&rsa,0,0);
  mbedtls_ctr_drbg_init(&ctr_drbg);
  mbedtls_entropy_init(&entropy);
  mbedtls_mpi_init(&N);
  mbedtls_mpi_init(&P);
  mbedtls_mpi_init(&Q);
  mbedtls_mpi_init(&D);
  mbedtls_mpi_init(&E);
  mbedtls_mpi_init(&DP);
  mbedtls_mpi_init(&DQ);
  mbedtls_mpi_init(&QP);
  uVar1 = mbedtls_ctr_drbg_seed(&ctr_drbg,mbedtls_entropy_func,&entropy,(uchar *)"rsa_decrypt",0xb);
  if (uVar1 == 0) {
    printf("\n  . Reading private key from rsa_priv.txt");
    fflush(_stdout);
    pFVar3 = fopen("rsa_priv.txt","rb");
    if (pFVar3 == (FILE *)0x0) {
      pcVar5 = " failed\n  ! Could not open rsa_priv.txt\n  ! Please run rsa_genkey first\n";
LAB_0010751b:
      puts(pcVar5);
    }
    else {
      uVar1 = mbedtls_mpi_read_file(&N,0x10,(FILE *)pFVar3);
      if (uVar1 == 0) {
        uVar1 = mbedtls_mpi_read_file(&E,0x10,(FILE *)pFVar3);
        if (uVar1 == 0) {
          uVar1 = mbedtls_mpi_read_file(&D,0x10,(FILE *)pFVar3);
          if (uVar1 == 0) {
            uVar1 = mbedtls_mpi_read_file(&P,0x10,(FILE *)pFVar3);
            if (uVar1 == 0) {
              uVar1 = mbedtls_mpi_read_file(&Q,0x10,(FILE *)pFVar3);
              if (uVar1 == 0) {
                uVar1 = mbedtls_mpi_read_file(&DP,0x10,(FILE *)pFVar3);
                if (uVar1 == 0) {
                  uVar1 = mbedtls_mpi_read_file(&DQ,0x10,(FILE *)pFVar3);
                  if (uVar1 == 0) {
                    uVar1 = mbedtls_mpi_read_file(&QP,0x10,(FILE *)pFVar3);
                    if (uVar1 == 0) {
                      fclose(pFVar3);
                      uVar1 = mbedtls_rsa_import(&rsa,&N,&P,&Q,&D,&E);
                      if (uVar1 == 0) {
                        uVar1 = mbedtls_rsa_complete(&rsa);
                        if (uVar1 != 0) {
                          pcVar5 = " failed\n  ! mbedtls_rsa_complete returned %d\n\n";
                          goto LAB_0010760c;
                        }
                        pFVar3 = fopen("result-enc.txt","rb");
                        if (pFVar3 == (FILE *)0x0) {
                          printf("\n  ! Could not open %s\n\n","result-enc.txt");
                          goto LAB_00107520;
                        }
                        i = 0;
                        uVar6 = 0;
                        iVar2 = __isoc99_fscanf(pFVar3,"%02X",&c);
                        if (0 < iVar2) {
                          uVar4 = 0;
                          do {
                            uVar6 = uVar4 + 1;
                            buf[uVar4] = (uchar)c;
                            i = uVar6;
                            iVar2 = __isoc99_fscanf(pFVar3,"%02X",&c);
                            if (iVar2 < 1) break;
                            bVar7 = uVar4 < 0x1ff;
                            uVar4 = uVar6;
                          } while (bVar7);
                        }
                        fclose(pFVar3);
                        if (uVar6 != rsa.len) {
                          pcVar5 = "\n  ! Invalid RSA signature format\n";
                          goto LAB_0010751b;
                        }
                        printf("\n  . Decrypting the encrypted data");
                        fflush(_stdout);
                        iVar2 = 1;
                        uVar1 = mbedtls_rsa_pkcs1_decrypt
                                          (&rsa,mbedtls_ctr_drbg_random,&ctr_drbg,1,&i,buf,result,
                                           0x400);
                        if (uVar1 == 0) {
                          puts("\n  . OK\n");
                          printf("The decrypted result is: \'%s\'\n\n",result);
                          iVar2 = 0;
                          goto LAB_00107525;
                        }
                        pcVar5 = " failed\n  ! mbedtls_rsa_pkcs1_decrypt returned %d\n\n";
                      }
                      else {
                        pcVar5 = " failed\n  ! mbedtls_rsa_import returned %d\n\n";
LAB_0010760c:
                        iVar2 = 0;
                      }
                      printf(pcVar5,(ulong)uVar1);
                      goto LAB_00107525;
                    }
                  }
                }
              }
            }
          }
        }
      }
      printf(" failed\n  ! mbedtls_mpi_read_file returned %d\n\n",(ulong)uVar1);
      fclose(pFVar3);
    }
  }
  else {
    printf(" failed\n  ! mbedtls_ctr_drbg_seed returned %d\n",(ulong)uVar1);
  }
LAB_00107520:
  iVar2 = 1;
LAB_00107525:
  mbedtls_ctr_drbg_free(&ctr_drbg);
  mbedtls_entropy_free(&entropy);
  mbedtls_rsa_free(&rsa);
  mbedtls_mpi_free(&N);
  mbedtls_mpi_free(&P);
  mbedtls_mpi_free(&Q);
  mbedtls_mpi_free(&D);
  mbedtls_mpi_free(&E);
  mbedtls_mpi_free(&DP);
  mbedtls_mpi_free(&DQ);
  mbedtls_mpi_free(&QP);
  return iVar2;
}

Assistant:

int main( int argc, char *argv[] )
{
    FILE *f;
    int return_val, exit_val, c;
    size_t i;
    mbedtls_rsa_context rsa;
    mbedtls_mpi N, P, Q, D, E, DP, DQ, QP;
    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    unsigned char result[1024];
    unsigned char buf[512];
    const char *pers = "rsa_decrypt";
    ((void) argv);

    memset(result, 0, sizeof( result ) );
    exit_val = MBEDTLS_EXIT_SUCCESS;

    if( argc != 1 )
    {
        mbedtls_printf( "usage: rsa_decrypt\n" );

#if defined(_WIN32)
        mbedtls_printf( "\n" );
#endif

        mbedtls_exit( MBEDTLS_EXIT_FAILURE );
    }

    mbedtls_printf( "\n  . Seeding the random number generator..." );
    fflush( stdout );

    mbedtls_rsa_init( &rsa, MBEDTLS_RSA_PKCS_V15, 0 );
    mbedtls_ctr_drbg_init( &ctr_drbg );
    mbedtls_entropy_init( &entropy );
    mbedtls_mpi_init( &N ); mbedtls_mpi_init( &P ); mbedtls_mpi_init( &Q );
    mbedtls_mpi_init( &D ); mbedtls_mpi_init( &E ); mbedtls_mpi_init( &DP );
    mbedtls_mpi_init( &DQ ); mbedtls_mpi_init( &QP );

    return_val = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func,
                                        &entropy, (const unsigned char *) pers,
                                        strlen( pers ) );
    if( return_val != 0 )
    {
        exit_val = MBEDTLS_EXIT_FAILURE;
        mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n",
                        return_val );
        goto exit;
    }

    mbedtls_printf( "\n  . Reading private key from rsa_priv.txt" );
    fflush( stdout );

    if( ( f = fopen( "rsa_priv.txt", "rb" ) ) == NULL )
    {
        exit_val = MBEDTLS_EXIT_FAILURE;
        mbedtls_printf( " failed\n  ! Could not open rsa_priv.txt\n" \
                "  ! Please run rsa_genkey first\n\n" );
        goto exit;
    }

    if( ( return_val = mbedtls_mpi_read_file( &N , 16, f ) )  != 0 ||
        ( return_val = mbedtls_mpi_read_file( &E , 16, f ) )  != 0 ||
        ( return_val = mbedtls_mpi_read_file( &D , 16, f ) )  != 0 ||
        ( return_val = mbedtls_mpi_read_file( &P , 16, f ) )  != 0 ||
        ( return_val = mbedtls_mpi_read_file( &Q , 16, f ) )  != 0 ||
        ( return_val = mbedtls_mpi_read_file( &DP , 16, f ) ) != 0 ||
        ( return_val = mbedtls_mpi_read_file( &DQ , 16, f ) ) != 0 ||
        ( return_val = mbedtls_mpi_read_file( &QP , 16, f ) ) != 0 )
    {
        exit_val = MBEDTLS_EXIT_FAILURE;
        mbedtls_printf( " failed\n  ! mbedtls_mpi_read_file returned %d\n\n",
                        return_val );
        fclose( f );
        goto exit;
    }
    fclose( f );

    if( ( return_val = mbedtls_rsa_import( &rsa, &N, &P, &Q, &D, &E ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_rsa_import returned %d\n\n",
                        return_val );
        goto exit;
    }

    if( ( return_val = mbedtls_rsa_complete( &rsa ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_rsa_complete returned %d\n\n",
                        return_val );
        goto exit;
    }

    /*
     * Extract the RSA encrypted value from the text file
     */
    if( ( f = fopen( "result-enc.txt", "rb" ) ) == NULL )
    {
        exit_val = MBEDTLS_EXIT_FAILURE;
        mbedtls_printf( "\n  ! Could not open %s\n\n", "result-enc.txt" );
        goto exit;
    }

    i = 0;

    while( fscanf( f, "%02X", &c ) > 0 &&
           i < (int) sizeof( buf ) )
        buf[i++] = (unsigned char) c;

    fclose( f );

    if( i != rsa.len )
    {
        exit_val = MBEDTLS_EXIT_FAILURE;
        mbedtls_printf( "\n  ! Invalid RSA signature format\n\n" );
        goto exit;
    }

    /*
     * Decrypt the encrypted RSA data and print the result.
     */
    mbedtls_printf( "\n  . Decrypting the encrypted data" );
    fflush( stdout );

    return_val = mbedtls_rsa_pkcs1_decrypt( &rsa, mbedtls_ctr_drbg_random,
                                            &ctr_drbg, MBEDTLS_RSA_PRIVATE, &i,
                                            buf, result, 1024 );
    if( return_val != 0 )
    {
        exit_val = MBEDTLS_EXIT_FAILURE;
        mbedtls_printf( " failed\n  ! mbedtls_rsa_pkcs1_decrypt returned %d\n\n",
                        return_val );
        goto exit;
    }

    mbedtls_printf( "\n  . OK\n\n" );

    mbedtls_printf( "The decrypted result is: '%s'\n\n", result );

exit:
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );
    mbedtls_rsa_free( &rsa );
    mbedtls_mpi_free( &N ); mbedtls_mpi_free( &P ); mbedtls_mpi_free( &Q );
    mbedtls_mpi_free( &D ); mbedtls_mpi_free( &E ); mbedtls_mpi_free( &DP );
    mbedtls_mpi_free( &DQ ); mbedtls_mpi_free( &QP );

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( exit_val );
}